

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O1

void __thiscall
transwarp::detail::task_impl_base<$1a67ba37$>::remove_listener_all
          (task_impl_base<_1a67ba37_> *this,shared_ptr<transwarp::listener> *listener)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  remove_listener_visitor local_20;
  
  ensure_task_not_running(this);
  local_20.listener_.super___shared_ptr<transwarp::listener,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (listener->super___shared_ptr<transwarp::listener,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_20.listener_.super___shared_ptr<transwarp::listener,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (listener->super___shared_ptr<transwarp::listener,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (local_20.listener_.super___shared_ptr<transwarp::listener,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20.listener_.super___shared_ptr<transwarp::listener,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_20.listener_.super___shared_ptr<transwarp::listener,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20.listener_.super___shared_ptr<transwarp::listener,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_20.listener_.super___shared_ptr<transwarp::listener,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  visit_depth_all<transwarp::detail::remove_listener_visitor>(this,&local_20);
  if (local_20.listener_.super___shared_ptr<transwarp::listener,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.listener_.
               super___shared_ptr<transwarp::listener,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  return;
}

Assistant:

void remove_listener_all(const std::shared_ptr<transwarp::listener>& listener) override {
        ensure_task_not_running();
        transwarp::detail::remove_listener_visitor visitor(std::move(listener));
        visit_depth_all(visitor);
    }